

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O2

RABlock * __thiscall
asmjit::ZoneStack<asmjit::RABlock_*>::popFirst(ZoneStack<asmjit::RABlock_*> *this)

{
  Block *pBVar1;
  undefined8 *puVar2;
  RABlock *pRVar3;
  bool bVar4;
  
  if ((this->super_ZoneStackBase)._allocator == (ZoneAllocator *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/zonestack.h"
               ,0xc0,"isInitialized()");
  }
  bVar4 = ZoneStackBase::empty(&this->super_ZoneStackBase);
  if (!bVar4) {
    pBVar1 = (this->super_ZoneStackBase)._block[0];
    puVar2 = (undefined8 *)pBVar1->_start;
    if (puVar2 != (undefined8 *)pBVar1->_end) {
      pRVar3 = (RABlock *)*puVar2;
      pBVar1->_start = puVar2 + 1;
      if (puVar2 + 1 == (undefined8 *)pBVar1->_end) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
      }
      return pRVar3;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/zonestack.h"
               ,0xc4,"!block->empty()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/zonestack.h"
             ,0xc1,"!empty()");
}

Assistant:

inline bool isInitialized() const noexcept { return _allocator != nullptr; }